

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch2sin.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  ostream *this;
  char *__s;
  double *sawtooth;
  _func_int **pp_Var6;
  string *input_stream;
  double *sin;
  _func_int **pp_Var7;
  double *cos;
  int interpolation_period;
  int frame_period;
  double unvoiced_value;
  double signal;
  ostringstream error_message_7;
  ifstream ifs;
  PeriodicWaveformGeneration waveform_generation;
  InputSourceInterpolationWithMagicNumber input_source_interpolation_with_magic_number;
  InputSourceFromStream input_source_from_stream;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  undefined8 local_4d0;
  double local_4c8;
  undefined1 local_4c0 [32];
  double local_4a0;
  string local_498 [3];
  ios_base local_428 [264];
  string local_320;
  byte abStack_300 [80];
  ios_base local_2b0 [408];
  undefined1 local_118 [32];
  bool local_f8;
  InputSourceInterpolationWithMagicNumber local_d8;
  InputSourceFromStream local_50;
  
  local_4d8 = 100;
  local_4dc = 1;
  local_4c8 = 0.0;
  local_4d0 = 0;
  local_4d4 = 0;
  do {
    iVar4 = ya_getopt_long(argc,argv,"p:i:o:u:sh",(option *)0x0,(int *)0x0);
    if (0xd < iVar4 - 0x68U) {
      if (iVar4 != -1) {
switchD_001037bd_caseD_6a:
        anon_unknown.dwarf_1fec::PrintUsage((ostream *)&std::cerr);
        return 1;
      }
      if (local_4d8 / 2 < local_4dc) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_320,"Interpolation period must be equal to or less than half ",
                   0x38);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"frame period",0xc)
        ;
        local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"pitch2sin","");
        sptk::PrintErrorMessage(local_498,(ostringstream *)&local_320);
        goto LAB_00103b1c;
      }
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_320,"Too many input files",0x14);
        local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"pitch2sin","");
        sptk::PrintErrorMessage(local_498,(ostringstream *)&local_320);
        goto LAB_00103b1c;
      }
      if (argc == ya_optind) {
        __s = (char *)0x0;
      }
      else {
        __s = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_320,"Cannot set translation mode",0x1b);
        local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"pitch2sin","");
        sptk::PrintErrorMessage(local_498,(ostringstream *)&local_320);
        goto LAB_00103b1c;
      }
      input_stream = &local_320;
      std::ifstream::ifstream(input_stream);
      if ((__s != (char *)0x0) &&
         (std::ifstream::open((char *)&local_320,(_Ios_Openmode)__s),
         (abStack_300[*(long *)(local_320._M_dataplus._M_p + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_498,"Cannot open file ",0x11);
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar5);
        local_d8.super_InputSourceInterface._vptr_InputSourceInterface =
             (_func_int **)&local_d8.first_interpolation_period_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"pitch2sin","");
        sptk::PrintErrorMessage((string *)&local_d8,(ostringstream *)local_498);
        if (local_d8.super_InputSourceInterface._vptr_InputSourceInterface !=
            (_func_int **)&local_d8.first_interpolation_period_) {
          operator_delete(local_d8.super_InputSourceInterface._vptr_InputSourceInterface);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
        std::ios_base::~ios_base(local_428);
        iVar4 = 1;
        goto LAB_0010403d;
      }
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        input_stream = (string *)&std::cin;
      }
      sptk::InputSourceFromStream::InputSourceFromStream(&local_50,false,1,(istream *)input_stream);
      sptk::InputSourceInterpolationWithMagicNumber::InputSourceInterpolationWithMagicNumber
                (&local_d8,local_4d8,local_4dc,false,0.0,&local_50.super_InputSourceInterface);
      if (local_d8.is_valid_ == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_498,"Failed to initialize InputSourceFromStream",0x2a);
        pp_Var7 = (_func_int **)(local_118 + 0x10);
        local_118._0_8_ = pp_Var7;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"pitch2sin","");
        sptk::PrintErrorMessage((string *)local_118,(ostringstream *)local_498);
        pp_Var6 = (_func_int **)local_118._0_8_;
        goto LAB_00104003;
      }
      sptk::PeriodicWaveformGeneration::PeriodicWaveformGeneration
                ((PeriodicWaveformGeneration *)local_118,local_4c8,(bool)((byte)local_4d0 & 1),
                 &local_d8);
      if (local_f8 == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_498,"Failed to initialize PeriodicWaveformGeneration",0x2f);
        local_4c0._0_8_ = local_4c0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"pitch2sin","");
        sptk::PrintErrorMessage((string *)local_4c0,(ostringstream *)local_498);
        goto LAB_00103ffe;
      }
      sin = (double *)0x0;
      if (local_4d4 == 0) {
        sin = &local_4a0;
      }
      cos = (double *)0x0;
      if (local_4d4 == 1) {
        cos = &local_4a0;
      }
      sawtooth = &local_4a0;
      if (local_4d4 != 2) {
        sawtooth = (double *)0x0;
      }
      break;
    }
    switch(iVar4) {
    case 0x68:
      anon_unknown.dwarf_1fec::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
      std::__cxx11::string::string((string *)&local_320,ya_optarg,(allocator *)local_498);
      bVar2 = sptk::ConvertStringToInteger(&local_320,&local_4dc);
      bVar1 = local_4dc < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p);
      }
      if (!bVar2 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_320,"The argument for the -i option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_320,"non-negative integer",0x14);
        local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"pitch2sin","");
        sptk::PrintErrorMessage(local_498,(ostringstream *)&local_320);
        goto LAB_00103b1c;
      }
      break;
    default:
      goto switchD_001037bd_caseD_6a;
    case 0x6f:
      std::__cxx11::string::string((string *)&local_320,ya_optarg,(allocator *)local_498);
      bVar2 = sptk::ConvertStringToInteger(&local_320,(int *)&local_d8);
      if (bVar2) {
        bVar2 = sptk::IsInRange((int)local_d8.super_InputSourceInterface._vptr_InputSourceInterface,
                                0,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p);
        }
        if (bVar2) {
          local_4d4 = (int)local_d8.super_InputSourceInterface._vptr_InputSourceInterface;
          break;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_320,"The argument for the -o option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_320,"in the range of ",0x10);
      this = (ostream *)std::ostream::operator<<((ostream *)&local_320,0);
      std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
      std::ostream::operator<<((ostream *)this,2);
      local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"pitch2sin","");
      sptk::PrintErrorMessage(local_498,(ostringstream *)&local_320);
      goto LAB_00103b1c;
    case 0x70:
      std::__cxx11::string::string((string *)&local_320,ya_optarg,(allocator *)local_498);
      bVar1 = sptk::ConvertStringToInteger(&local_320,&local_4d8);
      bVar2 = local_4d8 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p);
      }
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_320,"The argument for the -p option must be a positive integer"
                   ,0x39);
        local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"pitch2sin","");
        sptk::PrintErrorMessage(local_498,(ostringstream *)&local_320);
        goto LAB_00103b1c;
      }
      break;
    case 0x73:
      local_4d0 = CONCAT71((int7)((ulong)((long)&switchD_001037bd::switchdataD_0010c004 +
                                         (long)(int)(&switchD_001037bd::switchdataD_0010c004)
                                                    [iVar4 - 0x68U]) >> 8),1);
      break;
    case 0x75:
      std::__cxx11::string::string((string *)&local_320,ya_optarg,(allocator *)local_498);
      bVar2 = sptk::ConvertStringToDouble(&local_320,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p);
      }
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_320,"The argument for the -u option must be a number",0x2f);
        local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"pitch2sin","");
        sptk::PrintErrorMessage(local_498,(ostringstream *)&local_320);
LAB_00103b1c:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
          operator_delete(local_498[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
        std::ios_base::~ios_base(local_2b0);
        return 1;
      }
    }
  } while( true );
  while (bVar2 = sptk::WriteStream<double>(local_4a0,(ostream *)&std::cout), bVar2) {
    bVar2 = sptk::PeriodicWaveformGeneration::Get
                      ((PeriodicWaveformGeneration *)local_118,sin,cos,sawtooth,(double *)0x0);
    if (!bVar2) {
      iVar4 = 0;
      goto LAB_00104030;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_498,"Failed to write a periodic waveform",0x23);
  local_4c0._0_8_ = local_4c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"pitch2sin","");
  sptk::PrintErrorMessage((string *)local_4c0,(ostringstream *)local_498);
LAB_00103ffe:
  pp_Var7 = (_func_int **)(local_4c0 + 0x10);
  pp_Var6 = (_func_int **)local_4c0._0_8_;
LAB_00104003:
  if (pp_Var6 != pp_Var7) {
    operator_delete(pp_Var6);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  iVar4 = 1;
LAB_00104030:
  sptk::InputSourceInterpolationWithMagicNumber::~InputSourceInterpolationWithMagicNumber(&local_d8)
  ;
LAB_0010403d:
  std::ifstream::~ifstream(&local_320);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  int frame_period(kDefaultFramePeriod);
  int interpolation_period(kDefaultInterpolationPeriod);
  OutputFormats output_format(kDefaultOutputFormat);
  double unvoiced_value(kDefaultUnvoicedValue);
  bool strict(kDefaultStrictFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "p:i:o:u:sh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_period) ||
            frame_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &interpolation_period) ||
            interpolation_period < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &unvoiced_value)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be a number";
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        strict = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (frame_period / 2 < interpolation_period) {
    std::ostringstream error_message;
    error_message << "Interpolation period must be equal to or less than half "
                  << "frame period";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("pitch2sin", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::InputSourceFromStream input_source_from_stream(false, 1, &input_stream);
  sptk::InputSourceInterpolationWithMagicNumber
      input_source_interpolation_with_magic_number(
          frame_period, interpolation_period, false,
          kMagicNumberForUnvoicedFrame, &input_source_from_stream);
  if (!input_source_interpolation_with_magic_number.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSourceFromStream";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  sptk::PeriodicWaveformGeneration waveform_generation(
      unvoiced_value, strict, &input_source_interpolation_with_magic_number);
  if (!waveform_generation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize PeriodicWaveformGeneration";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  double signal;
  while (waveform_generation.Get(kSine == output_format ? &signal : NULL,
                                 kCosine == output_format ? &signal : NULL,
                                 kSawtooth == output_format ? &signal : NULL,
                                 NULL)) {
    if (!sptk::WriteStream(signal, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a periodic waveform";
      sptk::PrintErrorMessage("pitch2sin", error_message);
      return 1;
    }
  }

  return 0;
}